

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O2

void disable_inter_references_except_altref(_Bool (*ref_combo) [9])

{
  disable_reference('\x01',ref_combo);
  disable_reference('\x02',ref_combo);
  disable_reference('\x03',ref_combo);
  disable_reference('\x04',ref_combo);
  disable_reference('\x05',ref_combo);
  disable_reference('\x06',ref_combo);
  return;
}

Assistant:

static inline void disable_inter_references_except_altref(
    bool ref_combo[REF_FRAMES][REF_FRAMES + 1]) {
  disable_reference(LAST_FRAME, ref_combo);
  disable_reference(LAST2_FRAME, ref_combo);
  disable_reference(LAST3_FRAME, ref_combo);
  disable_reference(GOLDEN_FRAME, ref_combo);
  disable_reference(BWDREF_FRAME, ref_combo);
  disable_reference(ALTREF2_FRAME, ref_combo);
}